

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_storage_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  io_service *piVar1;
  ostream *poVar2;
  ptime pVar3;
  service srv;
  callback<void_(const_std::error_code_&)> local_40;
  deadline_timer timer;
  
  cppcms::service::service(&srv,argc,argv);
  piVar1 = (io_service *)cppcms::service::get_io_service();
  booster::aio::deadline_timer::deadline_timer(&timer,piVar1);
  pVar3 = booster::ptime::seconds(1);
  pVar3._8_8_ = pVar3.sec;
  pVar3.sec = (longlong)&timer;
  booster::aio::deadline_timer::expires_from_now(pVar3);
  booster::callback<void_(const_std::error_code_&)>::callback<stopper>(&local_40,&srv);
  booster::aio::deadline_timer::async_wait((callback *)&timer);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_40.call_ptr);
  cppcms::service::run();
  booster::aio::deadline_timer::~deadline_timer(&timer);
  cppcms::service::~service(&srv);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{

	try {
		cppcms::service srv(argc,argv);

		booster::aio::deadline_timer timer(srv.get_io_service());
		timer.expires_from_now(booster::ptime::seconds(1));
		timer.async_wait(stopper(&srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr<< "Failed: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}